

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O1

void dologpost(void *object,int level,char *s)

{
  char upbuf [1000];
  char acStack_3f8 [999];
  undefined1 local_11;
  
  local_11 = 0;
  if ((level < 4) || (sys_verbose != 0)) {
    if ((pd_maininstance.pd_stuff)->st_printhook == (t_printhook)0x0) {
      if (sys_printtostderr == 0) {
        pdgui_vmess("::pdwindow::logpost","ois",object);
        return;
      }
      fprintf(_stderr,"verbose(%d): %s",level,s);
      return;
    }
    snprintf(acStack_3f8,999,"verbose(%d): %s");
    (*(pd_maininstance.pd_stuff)->st_printhook)(acStack_3f8);
  }
  return;
}

Assistant:

static void dologpost(const void *object, const int level, const char *s)
{
    char upbuf[MAXPDSTRING];
    upbuf[MAXPDSTRING-1]=0;
        /* if it's a verbose message and we aren't set to 'verbose' just do
            nothing */
    if (level >= PD_VERBOSE && !sys_verbose)
        return;
    // what about sys_printhook_verbose ?
    if (STUFF->st_printhook)
    {
        snprintf(upbuf, MAXPDSTRING-1, "verbose(%d): %s", level, s);
        (*STUFF->st_printhook)(upbuf);
    }
    else if (sys_printtostderr)
    {
#ifdef _WIN32
    #ifdef _MSC_VER
        fwprintf(stderr, L"verbose(%d): %S", level, s);
    #else
        fwprintf(stderr, L"verbose(%d): %s", level, s);
    #endif
        fflush(stderr);
#else
        fprintf(stderr, "verbose(%d): %s", level, s);
#endif
    }
    else
        pdgui_vmess("::pdwindow::logpost", "ois",
                  object, level, s);
}